

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::~ArrayBuilder
          (ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *this)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (ArrayPtr<const_capnp::word> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (ArrayPtr<const_capnp::word> *)0x0;
    this->pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    this->endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pAVar1,0x10,(long)pRVar2 - (long)pAVar1 >> 4,
               (long)pAVar3 - (long)pAVar1 >> 4,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }